

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ConfigLiblistSyntax::setChild
          (ConfigLiblistSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxNode *this_00;
  TokenList *pTVar2;
  logic_error *this_01;
  Token TVar3;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index == 1) {
    this_00 = TokenOrSyntax::node(&child);
    pTVar2 = SyntaxNode::as<slang::syntax::TokenList>(this_00);
    (this->libraries).super_SyntaxListBase.super_SyntaxNode.parent =
         (pTVar2->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->libraries).super_SyntaxListBase.super_SyntaxNode.kind =
         (pTVar2->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->libraries).super_SyntaxListBase.childCount = (pTVar2->super_SyntaxListBase).childCount;
    sVar1 = (pTVar2->super_span<slang::parsing::Token,_18446744073709551615UL>).size_;
    (this->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>.data_ =
         (pTVar2->super_span<slang::parsing::Token,_18446744073709551615UL>).data_;
    (this->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ = sVar1;
  }
  else {
    if (index != 0) {
      this_01 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_98,&local_b8,":");
      std::__cxx11::to_string(&local_d8,0xb89);
      std::operator+(&local_78,&local_98,&local_d8);
      std::operator+(&local_58,&local_78,": ");
      std::operator+(&local_38,&local_58,"Default case should be unreachable!");
      std::logic_error::logic_error(this_01,(string *)&local_38);
      __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->liblist).kind = TVar3.kind;
    (this->liblist).field_0x2 = TVar3._2_1_;
    (this->liblist).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->liblist).rawLen = TVar3.rawLen;
    (this->liblist).info = TVar3.info;
  }
  return;
}

Assistant:

void ConfigLiblistSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: liblist = child.token(); return;
        case 1: libraries = child.node()->as<TokenList>(); return;
        default: ASSUME_UNREACHABLE;
    }
}